

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>_>
::WriteCon2JSON(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>_>
                *this,MemoryWriter *wrt,int i_con,Container *cnt)

{
  uint uVar1;
  char *pcVar2;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_58;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_48;
  char *local_38 [2];
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_28;
  
  local_48.kind_ = Unset;
  local_48.n_written_ = 0;
  local_48.wrt_ = wrt;
  pcVar2 = BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
  key._M_str = (char *)0x8;
  key._M_len = (size_t)&local_48;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_58,key);
  if (local_58.kind_ == Unset) {
    local_58.kind_ = Scalar;
  }
  local_38[0] = pcVar2;
  fmt::BasicWriter<char>::write
            (&(local_58.wrt_)->super_BasicWriter<char>,0x49f13a,(void *)0xa,(size_t)local_38);
  local_58.n_written_ = local_58.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  key_00._M_str = (char *)0x5;
  key_00._M_len = (size_t)&local_48;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_58,key_00)
  ;
  if (local_58.kind_ == Unset) {
    local_58.kind_ = Scalar;
  }
  local_38[0] = (char *)(ulong)(uint)i_con;
  fmt::BasicWriter<char>::write
            (&(local_58.wrt_)->super_BasicWriter<char>,0x4b9e95,(void *)0x2,(size_t)local_38);
  local_58.n_written_ = local_58.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  pcVar2 = (cnt->con_).con_flat_.super_BasicConstraint.name_._M_dataplus._M_p;
  if (*pcVar2 != '\0') {
    key_01._M_str = (char *)0x4;
    key_01._M_len = (size_t)&local_48;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (&local_58,key_01);
    if (local_58.kind_ == Unset) {
      local_58.kind_ = Scalar;
    }
    local_38[0] = pcVar2;
    fmt::BasicWriter<char>::write
              (&(local_58.wrt_)->super_BasicWriter<char>,0x49f13a,(void *)0xa,(size_t)local_38);
    local_58.n_written_ = local_58.n_written_ + 1;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  }
  uVar1 = cnt->depth_;
  key_02._M_str = (char *)0x5;
  key_02._M_len = (size_t)&local_48;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_58,key_02)
  ;
  if (local_58.kind_ == Unset) {
    local_58.kind_ = Scalar;
  }
  local_38[0] = (char *)(ulong)uVar1;
  fmt::BasicWriter<char>::write
            (&(local_58.wrt_)->super_BasicWriter<char>,0x4b9e95,(void *)0x2,(size_t)local_38);
  local_58.n_written_ = local_58.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  key_03._M_str = (char *)0x4;
  key_03._M_len = (size_t)&local_48;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_28,key_03)
  ;
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,mp::RotatedQuadraticConeId>
            (&local_28,
             (CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
              *)cnt);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_28);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_48);
  return;
}

Assistant:

void WriteCon2JSON(
      fmt::MemoryWriter& wrt, int i_con, const Container& cnt) {
    MiniJSONWriter jw(wrt);
    jw["CON_TYPE"] = GetShortTypeName();
    jw["index"] = i_con;
    if (*cnt.GetCon().name())
      jw["name"] = cnt.GetCon().name();
    jw["depth"] = cnt.GetDepth();
    WriteJSON(jw["data"], cnt.GetCon());
  }